

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair>::reallocateAndGrow
          (QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *old)

{
  long lVar1;
  bool bVar2;
  QPodArrayOps<QGraphicsItemAnimationPrivate::Pair> *this_00;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> dp;
  undefined4 in_stack_ffffffffffffff78;
  AllocationOption in_stack_ffffffffffffff7c;
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI != 0) || (in_RCX != 0)) || (bVar2 = needsDetach(in_stack_ffffffffffffff80), bVar2))
     || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *)&DAT_aaaaaaaaaaaaaaaa,
                 -0x5555555555555556,0xaaaaaaaa);
    if (0 < in_RDX) {
      qt_noop();
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<QGraphicsItemAnimationPrivate::Pair> *)
                  operator->((QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *)
                             &stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *)0xa63fec);
        begin((QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *)0xa63ffb);
        QtPrivate::QPodArrayOps<QGraphicsItemAnimationPrivate::Pair>::copyAppend
                  (this_00,(Pair *)in_stack_ffffffffffffff88,(Pair *)in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *)
             operator->((QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *)
                        &stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *)0xa64034);
        begin((QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *)0xa64043);
        QtPrivate::QPodArrayOps<QGraphicsItemAnimationPrivate::Pair>::moveAppend
                  ((QPodArrayOps<QGraphicsItemAnimationPrivate::Pair> *)in_stack_ffffffffffffff80,
                   (Pair *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (Pair *)0xa64061);
      }
    }
    swap(in_stack_ffffffffffffff80,
         (QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *)
         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff80,
           (QArrayDataPointer<QGraphicsItemAnimationPrivate::Pair> *)
           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff80);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff80);
    freeSpaceAtEnd(in_stack_ffffffffffffff88);
    QtPrivate::QPodArrayOps<QGraphicsItemAnimationPrivate::Pair>::reallocate
              ((QPodArrayOps<QGraphicsItemAnimationPrivate::Pair> *)in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }